

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall FactoredDecPOMDPDiscrete::InitializeStorage(FactoredDecPOMDPDiscrete *this)

{
  pointer ppRVar1;
  value_type local_28;
  
  std::vector<Scope,_std::allocator<Scope>_>::_M_erase_at_end
            (&this->_m_sfScopes,
             (this->_m_sfScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<Scope,_std::allocator<Scope>_>::_M_erase_at_end
            (&this->_m_agScopes,
             (this->_m_agScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
             super__Vector_impl_data._M_start);
  ppRVar1 = (this->_m_LRFs).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_m_LRFs).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppRVar1) {
    (this->_m_LRFs).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppRVar1;
  }
  std::vector<Scope,_std::allocator<Scope>_>::resize(&this->_m_sfScopes,this->_m_nrLRFs);
  std::vector<Scope,_std::allocator<Scope>_>::resize(&this->_m_agScopes,this->_m_nrLRFs);
  local_28 = (value_type)0x0;
  std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::resize
            (&this->_m_LRFs,this->_m_nrLRFs,&local_28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->_m_nrXIs,this->_m_nrLRFs);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->_m_nrAIs,this->_m_nrLRFs);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->_m_nrSFVals,this->_m_nrLRFs);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->_m_nrActionVals,this->_m_nrLRFs);
  return;
}

Assistant:

void FactoredDecPOMDPDiscrete::InitializeStorage()
{
    _m_sfScopes.clear();
    _m_agScopes.clear();
    _m_LRFs.clear();
    _m_sfScopes.resize(_m_nrLRFs);
    _m_agScopes.resize(_m_nrLRFs);
    _m_LRFs.resize(_m_nrLRFs, 0);
    
    //allocate storage for the instantiation information
    _m_nrXIs.resize(_m_nrLRFs);
    _m_nrAIs.resize(_m_nrLRFs);
    _m_nrSFVals.resize(_m_nrLRFs);
    _m_nrActionVals.resize(_m_nrLRFs);
}